

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facenet.cpp
# Opt level: O3

void __thiscall
facenet::Inception_resnet_B(facenet *this,pBox *input,pBox *output,string *filepath,float scale)

{
  pointer pcVar1;
  pBox *outpBox;
  pBox *outpBox_00;
  pBox *outpBox_01;
  pBox *outpBox_02;
  pBox *output_00;
  pBox *outpBox_03;
  Weight *weight;
  Weight *weight_00;
  Weight *weight_01;
  Weight *weight_02;
  Weight *weight_03;
  Weight *weight_04;
  BN *var;
  BN *mean;
  BN *beta;
  BN *var_00;
  BN *mean_00;
  BN *beta_00;
  BN *var_01;
  BN *mean_01;
  BN *beta_01;
  BN *var_02;
  BN *mean_02;
  BN *beta_02;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  string local_198;
  mydataFmt *local_178;
  mydataFmt *local_170;
  mydataFmt *local_168;
  mydataFmt *local_160;
  mydataFmt *local_158;
  mydataFmt *local_150;
  mydataFmt *local_148;
  mydataFmt *local_140;
  mydataFmt *local_138;
  mydataFmt *local_130;
  mydataFmt *local_128;
  mydataFmt *local_120;
  mydataFmt *local_118;
  mydataFmt *local_110;
  mydataFmt *local_108;
  mydataFmt *local_100;
  mydataFmt *local_f8;
  mydataFmt *pmStack_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  long dataNumber [20];
  
  outpBox = (pBox *)operator_new(0x38);
  (outpBox->super_String)._M_dataplus._M_p = (pointer)&(outpBox->super_String).field_2;
  (outpBox->super_String)._M_string_length = 0;
  (outpBox->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_00 = (pBox *)operator_new(0x38);
  (outpBox_00->super_String)._M_dataplus._M_p = (pointer)&(outpBox_00->super_String).field_2;
  (outpBox_00->super_String)._M_string_length = 0;
  (outpBox_00->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_01 = (pBox *)operator_new(0x38);
  (outpBox_01->super_String)._M_dataplus._M_p = (pointer)&(outpBox_01->super_String).field_2;
  (outpBox_01->super_String)._M_string_length = 0;
  (outpBox_01->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_02 = (pBox *)operator_new(0x38);
  (outpBox_02->super_String)._M_dataplus._M_p = (pointer)&(outpBox_02->super_String).field_2;
  (outpBox_02->super_String)._M_string_length = 0;
  (outpBox_02->super_String).field_2._M_local_buf[0] = '\0';
  output_00 = (pBox *)operator_new(0x38);
  (output_00->super_String)._M_dataplus._M_p = (pointer)&(output_00->super_String).field_2;
  (output_00->super_String)._M_string_length = 0;
  (output_00->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_03 = (pBox *)operator_new(0x38);
  (outpBox_03->super_String)._M_dataplus._M_p = (pointer)&(outpBox_03->super_String).field_2;
  (outpBox_03->super_String)._M_string_length = 0;
  (outpBox_03->super_String).field_2._M_local_buf[0] = '\0';
  weight = (Weight *)operator_new(0x38);
  weight_00 = (Weight *)operator_new(0x38);
  weight_01 = (Weight *)operator_new(0x38);
  weight_02 = (Weight *)operator_new(0x38);
  weight_03 = (Weight *)operator_new(0x38);
  weight_04 = (Weight *)operator_new(0x38);
  var = (BN *)operator_new(0x10);
  mean = (BN *)operator_new(0x10);
  beta = (BN *)operator_new(0x10);
  var_00 = (BN *)operator_new(0x10);
  mean_00 = (BN *)operator_new(0x10);
  beta_00 = (BN *)operator_new(0x10);
  var_01 = (BN *)operator_new(0x10);
  mean_01 = (BN *)operator_new(0x10);
  beta_01 = (BN *)operator_new(0x10);
  var_02 = (BN *)operator_new(0x10);
  mean_02 = (BN *)operator_new(0x10);
  beta_02 = (BN *)operator_new(0x10);
  lVar2 = ConvAndFcInit(weight,0x80,0x380,1,1,0,0,0,0,0);
  BatchNormInit(beta,mean,var,0x80);
  lVar3 = ConvAndFcInit(weight_00,0x80,0x380,1,1,0,0,0,0,0);
  BatchNormInit(beta_00,mean_00,var_00,0x80);
  lVar4 = ConvAndFcInit(weight_01,0x80,0x80,0,1,-1,7,1,3,0);
  BatchNormInit(beta_01,mean_01,var_01,0x80);
  lVar5 = ConvAndFcInit(weight_02,0x80,0x80,0,1,-1,1,7,0,3);
  BatchNormInit(beta_02,mean_02,var_02,0x80);
  lVar6 = ConvAndFcInit(weight_03,0x380,0x100,1,1,0,0,0,0,0);
  dataNumber[0x12] = ConvAndFcInit(weight_04,0x380,0,0,0,0,0,0,0,0);
  dataNumber[1] = 0x80;
  dataNumber[2] = 0x80;
  dataNumber[3] = 0x80;
  dataNumber[5] = 0x80;
  dataNumber[6] = 0x80;
  dataNumber[7] = 0x80;
  dataNumber[9] = 0x80;
  dataNumber[10] = 0x80;
  dataNumber[0xb] = 0x80;
  dataNumber[0xd] = 0x80;
  dataNumber[0xe] = 0x80;
  dataNumber[0xf] = 0x80;
  dataNumber[0x11] = 0x380;
  dataNumber[0x13] = 0;
  local_178 = weight->pdata;
  local_170 = beta->pdata;
  local_168 = mean->pdata;
  local_160 = var->pdata;
  local_158 = weight_00->pdata;
  local_150 = beta_00->pdata;
  local_148 = mean_00->pdata;
  local_140 = var_00->pdata;
  local_138 = weight_01->pdata;
  local_130 = beta_01->pdata;
  local_128 = mean_01->pdata;
  local_120 = var_01->pdata;
  local_118 = weight_02->pdata;
  local_110 = beta_02->pdata;
  local_108 = mean_02->pdata;
  local_100 = var_02->pdata;
  local_f8 = weight_03->pdata;
  pmStack_f0 = weight_03->pbias;
  local_e8 = *(undefined4 *)&weight_04->pdata;
  uStack_e4 = *(undefined4 *)((long)&weight_04->pdata + 4);
  uStack_e0 = *(undefined4 *)&weight_04->pbias;
  uStack_dc = *(undefined4 *)((long)&weight_04->pbias + 4);
  pcVar1 = (filepath->_M_dataplus)._M_p;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  dataNumber[0] = lVar2;
  dataNumber[4] = lVar3;
  dataNumber[8] = lVar4;
  dataNumber[0xc] = lVar5;
  dataNumber[0x10] = lVar6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar1,pcVar1 + filepath->_M_string_length);
  readData(&local_198,dataNumber,&local_178,0x14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  convolutionInit(weight,input,outpBox);
  convolution(weight,input,outpBox);
  BatchNorm(outpBox,beta,mean,var);
  relu(outpBox,weight->pbias);
  convolutionInit(weight_00,input,outpBox_00);
  convolution(weight_00,input,outpBox_00);
  BatchNorm(outpBox_00,beta_00,mean_00,var_00);
  relu(outpBox_00,weight_00->pbias);
  convolutionInit(weight_01,outpBox_00,outpBox_01);
  convolution(weight_01,outpBox_00,outpBox_01);
  BatchNorm(outpBox_01,beta_01,mean_01,var_01);
  relu(outpBox_01,weight_01->pbias);
  convolutionInit(weight_02,outpBox_01,outpBox_02);
  convolution(weight_02,outpBox_01,outpBox_02);
  BatchNorm(outpBox_02,beta_02,mean_02,var_02);
  relu(outpBox_02,weight_02->pbias);
  conv_mergeInit(output_00,outpBox,outpBox_02,(pBox *)0x0,(pBox *)0x0);
  conv_merge(output_00,outpBox,outpBox_02,(pBox *)0x0,(pBox *)0x0);
  convolutionInit(weight_03,output_00,outpBox_03);
  convolution(weight_03,output_00,outpBox_03);
  addbias(outpBox_03,weight_03->pbias);
  mulandaddInit(input,outpBox_03,output);
  mulandadd(input,outpBox_03,output,scale);
  relu(output,weight_04->pbias);
  freepBox(outpBox);
  freepBox(outpBox_00);
  freepBox(outpBox_01);
  freepBox(outpBox_02);
  freepBox(output_00);
  freepBox(outpBox_03);
  freeWeight(weight);
  freeWeight(weight_00);
  freeWeight(weight_01);
  freeWeight(weight_02);
  freeWeight(weight_03);
  freeWeight(weight_04);
  freeBN(var);
  freeBN(mean);
  freeBN(beta);
  freeBN(var_00);
  freeBN(mean_00);
  freeBN(beta_00);
  freeBN(var_01);
  freeBN(mean_01);
  freeBN(beta_01);
  freeBN(var_02);
  freeBN(mean_02);
  freeBN(beta_02);
  return;
}

Assistant:

void facenet::Inception_resnet_B(pBox *input, pBox *output, string filepath, float scale) {
    pBox *conv1_out = new pBox;
    pBox *conv2_out = new pBox;
    pBox *conv3_out = new pBox;
    pBox *conv4_out = new pBox;
    pBox *conv5_out = new pBox;
    pBox *conv6_out = new pBox;

    struct Weight *conv1_wb = new Weight;
    struct Weight *conv2_wb = new Weight;
    struct Weight *conv3_wb = new Weight;
    struct Weight *conv4_wb = new Weight;
    struct Weight *conv5_wb = new Weight;
    struct Weight *conv6_wb = new Weight;

    struct BN *conv1_var = new BN;
    struct BN *conv1_mean = new BN;
    struct BN *conv1_beta = new BN;
    struct BN *conv2_var = new BN;
    struct BN *conv2_mean = new BN;
    struct BN *conv2_beta = new BN;
    struct BN *conv3_var = new BN;
    struct BN *conv3_mean = new BN;
    struct BN *conv3_beta = new BN;
    struct BN *conv4_var = new BN;
    struct BN *conv4_mean = new BN;
    struct BN *conv4_beta = new BN;


    long conv1 = ConvAndFcInit(conv1_wb, 128, 896, 1, 1, 0);
    BatchNormInit(conv1_beta, conv1_mean, conv1_var, 128);

    long conv2 = ConvAndFcInit(conv2_wb, 128, 896, 1, 1, 0);
    BatchNormInit(conv2_beta, conv2_mean, conv2_var, 128);
    long conv3 = ConvAndFcInit(conv3_wb, 128, 128, 0, 1, -1, 7, 1, 3, 0);//[1,7]
    BatchNormInit(conv3_beta, conv3_mean, conv3_var, 128);
    long conv4 = ConvAndFcInit(conv4_wb, 128, 128, 0, 1, -1, 1, 7, 0, 3);//[7,1]
    BatchNormInit(conv4_beta, conv4_mean, conv4_var, 128);

    long conv5 = ConvAndFcInit(conv5_wb, 896, 256, 1, 1, 0);

    long conv6 = ConvAndFcInit(conv6_wb, 896, 0, 0, 0, 0);

    long dataNumber[20] = {conv1, 128, 128, 128, conv2, 128, 128, 128, conv3, 128, 128, 128, conv4, 128, 128, 128,
                           conv5, 896, conv6, 0};

//    mydataFmt *pointTeam[20] = {
//                            conv1_wb->pdata, conv1_var->pdata, conv1_mean->pdata, conv1_beta->pdata, \
//                            conv2_wb->pdata, conv2_var->pdata, conv2_mean->pdata, conv2_beta->pdata, \
//                            conv3_wb->pdata, conv3_var->pdata, conv3_mean->pdata, conv3_beta->pdata, \
//                            conv4_wb->pdata, conv4_var->pdata, conv4_mean->pdata, conv4_beta->pdata, \
//                            conv5_wb->pdata, conv5_wb->pbias, \
//                            conv6_wb->pdata, conv6_wb->pbias};
    mydataFmt *pointTeam[20] = {
                            conv1_wb->pdata, conv1_beta->pdata, conv1_mean->pdata, conv1_var->pdata, \
                            conv2_wb->pdata, conv2_beta->pdata, conv2_mean->pdata, conv2_var->pdata, \
                            conv3_wb->pdata, conv3_beta->pdata, conv3_mean->pdata, conv3_var->pdata, \
                            conv4_wb->pdata, conv4_beta->pdata, conv4_mean->pdata, conv4_var->pdata, \
                            conv5_wb->pdata, conv5_wb->pbias, \
                            conv6_wb->pdata, conv6_wb->pbias};


    readData(filepath, dataNumber, pointTeam, 20);


    convolutionInit(conv1_wb, input, conv1_out);
    //conv1 17*17*128
    convolution(conv1_wb, input, conv1_out);
    BatchNorm(conv1_out, conv1_beta, conv1_mean, conv1_var);
    relu(conv1_out, conv1_wb->pbias);

    convolutionInit(conv2_wb, input, conv2_out);
    //conv2 17*17*128
    convolution(conv2_wb, input, conv2_out);
    BatchNorm(conv2_out, conv2_beta, conv2_mean, conv2_var);
    relu(conv2_out, conv2_wb->pbias);

    convolutionInit(conv3_wb, conv2_out, conv3_out);
    //conv3 17*17*128
    convolution(conv3_wb, conv2_out, conv3_out);
    BatchNorm(conv3_out, conv3_beta, conv3_mean, conv3_var);
    relu(conv3_out, conv3_wb->pbias);
    convolutionInit(conv4_wb, conv3_out, conv4_out);
    //conv4 17*17*128
    convolution(conv4_wb, conv3_out, conv4_out);
    BatchNorm(conv4_out, conv4_beta, conv4_mean, conv4_var);
    relu(conv4_out, conv4_wb->pbias);

    conv_mergeInit(conv5_out, conv1_out, conv4_out);
    //17*17*256
    conv_merge(conv5_out, conv1_out, conv4_out);

    convolutionInit(conv5_wb, conv5_out, conv6_out);
    //conv5 17*17*896
    convolution(conv5_wb, conv5_out, conv6_out);
    addbias(conv6_out, conv5_wb->pbias);

    mulandaddInit(input, conv6_out, output);
    mulandadd(input, conv6_out, output, scale);
    relu(output, conv6_wb->pbias);

    freepBox(conv1_out);
    freepBox(conv2_out);
    freepBox(conv3_out);
    freepBox(conv4_out);
    freepBox(conv5_out);
    freepBox(conv6_out);

    freeWeight(conv1_wb);
    freeWeight(conv2_wb);
    freeWeight(conv3_wb);
    freeWeight(conv4_wb);
    freeWeight(conv5_wb);
    freeWeight(conv6_wb);

    freeBN(conv1_var);
    freeBN(conv1_mean);
    freeBN(conv1_beta);
    freeBN(conv2_var);
    freeBN(conv2_mean);
    freeBN(conv2_beta);
    freeBN(conv3_var);
    freeBN(conv3_mean);
    freeBN(conv3_beta);
    freeBN(conv4_var);
    freeBN(conv4_mean);
    freeBN(conv4_beta);
}